

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>::swap_columns
          (Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  Index columnIndex2_local;
  Index columnIndex1_local;
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_> *this_local;
  
  Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
  ::swap_columns(&(this->matrix_).
                  super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
                 ,columnIndex1,columnIndex2);
  return;
}

Assistant:

inline void Matrix<PersistenceMatrixOptions>::swap_columns(Index columnIndex1, Index columnIndex2)
{
  static_assert(
      (!isNonBasic && !PersistenceMatrixOptions::has_column_compression) ||
          (isNonBasic && PersistenceMatrixOptions::is_of_boundary_type && !PersistenceMatrixOptions::has_vine_update &&
           !PersistenceMatrixOptions::can_retrieve_representative_cycles),
      "This method was not enabled.");
  return matrix_.swap_columns(columnIndex1, columnIndex2);
}